

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

void logmatch(logdir *ld)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  
  ld->match = '+';
  ld->matcherr = 'E';
  uVar5 = 0;
  do {
    if ((ld->inst).len <= uVar5) {
      return;
    }
    pcVar4 = (ld->inst).s;
    cVar1 = pcVar4[(int)uVar5];
    if (cVar1 == '+') {
LAB_00105012:
      iVar2 = pmatch(pcVar4 + (long)(int)uVar5 + 1,line,(uint)linelen);
      pcVar4 = (ld->inst).s;
      if (iVar2 != 0) {
        ld->match = pcVar4[(int)uVar5];
      }
    }
    else if ((cVar1 == 'e') || (cVar1 == 'E')) {
      iVar2 = pmatch(pcVar4 + (long)(int)uVar5 + 1,line,(uint)linelen);
      pcVar4 = (ld->inst).s;
      if (iVar2 != 0) {
        ld->matcherr = pcVar4[(int)uVar5];
      }
    }
    else if (cVar1 == '-') goto LAB_00105012;
    uVar3 = byte_chr(pcVar4 + (int)uVar5,(ld->inst).len - uVar5,0);
    uVar5 = uVar5 + uVar3 + 1;
  } while( true );
}

Assistant:

void logmatch(struct logdir *ld) {
  int i;

  ld->match ='+';
  ld->matcherr ='E';
  for (i =0; i < ld->inst.len; ++i) {
    switch(ld->inst.s[i]) {
    case '+':
    case '-':
      if (pmatch(&ld->inst.s[i +1], line, linelen))
        ld->match =ld->inst.s[i];
      break;
    case 'e':
    case 'E':
      if (pmatch(&ld->inst.s[i +1], line, linelen))
        ld->matcherr =ld->inst.s[i];
      break;
    }
    i +=byte_chr(&ld->inst.s[i], ld->inst.len -i, 0);
  }
}